

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O3

ND_BOOL ShemuX86TrackLoop(SHEMU_CONTEXT *Context,ND_BOOL Taken)

{
  ND_UINT64 *pNVar1;
  ND_UINT64 NVar2;
  ulong uVar3;
  ulong uVar4;
  
  NVar2 = (Context->Arch).X86.Registers.RegRip;
  uVar4 = NVar2 + *(long *)((long)&Context->Arch + 0x48);
  uVar3 = NVar2 - *(byte *)((long)&Context->Arch + 0xb);
  if (uVar4 < uVar3) {
    NVar2 = (Context->LoopTrack).Address;
    if (Taken != '\0') {
      if (uVar3 == NVar2) {
        pNVar1 = &(Context->LoopTrack).Iteration;
        *pNVar1 = *pNVar1 + 1;
        return Taken;
      }
      ShemuX86TrackLoopStop(Context);
      if ((Context->LoopTrack).Active != '\0') {
        return Taken;
      }
      (Context->LoopTrack).Active = '\x01';
      (Context->LoopTrack).Iteration = 1;
      (Context->LoopTrack).Address = uVar3;
      (Context->LoopTrack).Target = uVar4;
      if ((Context->Options & 0x80) == 0) {
        return Taken;
      }
      shemu_internal_printf
                (Context,"        Loop BEGIN from RIP 0x%016llx, TARGET 0x%016llx, ITER %llu\n",
                 uVar3,uVar4,1);
      return Taken;
    }
    if (uVar3 != NVar2) {
      return '\0';
    }
  }
  else {
    if (Taken == '\0') {
      return '\0';
    }
    if (((Context->LoopTrack).Target <= uVar4) && (uVar4 <= (Context->LoopTrack).Address)) {
      return Taken;
    }
  }
  ShemuX86TrackLoopStop(Context);
  return Taken;
}

Assistant:

static ND_BOOL
ShemuX86TrackLoop(
    SHEMU_CONTEXT *Context,
    ND_BOOL Taken
    )
{
    ND_UINT64 rip, target;

    // The address of the loop instruction itself, not the next instruction.
    rip = Context->Arch.X86.Registers.RegRip - Context->Arch.X86.Instruction.Length;

    // The branches we monitor always have a relative offset, which is the first operand.
    target = Context->Arch.X86.Registers.RegRip + Context->Arch.X86.Instruction.Operands[0].Info.RelativeOffset.Rel;

    if (target < rip)
    {
        // Case 1: Backward branch.
        if (Taken)
        {
            // Taken backward branch instruction.
            if (rip == Context->LoopTrack.Address)
            {
                // Current active loop, this is a new iteration. Example:
                // label1:                  <--+
                //      ...                    |
                //      loop    label1      ---+
                //      ...
                // Update loop information.
                Context->LoopTrack.Iteration++;
            }
            else
            {
                // New loop, or loop within our current loop. Always track the inner most loop. Example:
                // label1:                  <--+
                //      ...                    |
                // label2:              <--+   |
                //      ...                |   |
                //      loop    label2  ---+   |
                //      ...                    |
                //      loop    label1      ---+
                //      ...
                // Start tracking the (potentially new) loop.
                ShemuX86TrackLoopStop(Context);

                ShemuX86TrackLoopStart(Context, rip, target);
            }
        }
        else
        {
            // Not taken backward branch instruction.
            if (rip == Context->LoopTrack.Address)
            {
                // Current loop ends, the loop instruction is no longer taken. Example:
                // label1:
                //      ...
                //      loop    label1      ---+
                //      ...                 <--+
                // Stop tracking.
                ShemuX86TrackLoopStop(Context);
            }
            else
            {
                // Not taken backward branch, but not our current loop.
                // Nothing to do.
            }
        }
    }
    else
    {
        // Case 2: Forward branch.
        if (Taken)
        {
            // Taken forward branch instruction.
            if (target < Context->LoopTrack.Target || target > Context->LoopTrack.Address)
            {
                // Break instruction. Example:
                // label1:
                //      ...
                //      jnz     label2      ---+
                //      ...                    |
                //      loop    label1         |
                //      ...                    |
                // label2:                  <--+
                //      ...
                // Stop tracking.
                ShemuX86TrackLoopStop(Context);
            }
            else
            {
                // If instruction. Example:
                // label1:
                //      ...
                //      jnz     label2      ---+
                //      ...                    |
                // label2:                  <--+
                //      ...
                //      loop    label1
                //      ...
                // Nothing to do.
            }
        }
        else
        {
            // Not taken forward branch instruction.
            // Nothing to do.
        }
    }

    // In theory, we can override whether the branch is taken or not, but for now, this is not used.
    return Taken;
}